

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test::testBody
          (TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedCallsDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_a1;
  SimpleString local_a0;
  MockExpectedCallsList local_90;
  SimpleString local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_a1);
  MockExpectedCallsList::MockExpectedCallsList(&local_90);
  local_90._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_70,"foo");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)&local_90,(SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)&local_70,test,&local_90);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&local_80);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x24])(pMVar1);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])(pMVar1);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x153);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_90);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_a1);
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherStillFailsIfExpectedOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foo");
    mock().ignoreOtherCalls();
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}